

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::SectionTracking::TrackedSection::addChild(TrackedSection *this,string *childName)

{
  TrackedSection local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  local_98;
  string *local_18;
  string *childName_local;
  TrackedSection *this_local;
  
  local_18 = childName;
  childName_local = &this->m_name;
  TrackedSection(&local_f8,childName,this);
  std::make_pair<std::__cxx11::string_const&,Catch::SectionTracking::TrackedSection>
            (&local_98,childName,&local_f8);
  std::
  map<std::__cxx11::string,Catch::SectionTracking::TrackedSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
  ::insert<std::pair<std::__cxx11::string,Catch::SectionTracking::TrackedSection>>
            ((map<std::__cxx11::string,Catch::SectionTracking::TrackedSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
              *)&this->m_children,&local_98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  ::~pair(&local_98);
  ~TrackedSection(&local_f8);
  return;
}

Assistant:

void addChild( std::string const& childName ) {
            m_children.insert( std::make_pair( childName, TrackedSection( childName, this ) ) );
        }